

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::_::concat<kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,CappedArray<char,_8UL> *params,
          ArrayPtr<const_char> *params_1)

{
  size_t size;
  char *target;
  CappedArray<char,_8UL> *first;
  ArrayPtr<const_char> *rest;
  size_type extraout_RDX;
  initializer_list<unsigned_long> nums;
  size_t local_48;
  size_t local_40;
  _ *local_38;
  undefined8 local_30;
  undefined1 local_21;
  CappedArray<char,_8UL> *local_20;
  ArrayPtr<const_char> *params_local_1;
  CappedArray<char,_8UL> *params_local;
  String *result;
  
  local_21 = 0;
  local_20 = params;
  params_local_1 = (ArrayPtr<const_char> *)this;
  params_local = (CappedArray<char,_8UL> *)__return_storage_ptr__;
  local_48 = CappedArray<char,_8UL>::size((CappedArray<char,_8UL> *)this);
  local_40 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)local_20);
  local_38 = (_ *)&local_48;
  local_30 = 2;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x2;
  size = sum(local_38,nums);
  heapString(__return_storage_ptr__,size);
  target = String::begin(__return_storage_ptr__);
  first = fwd<kj::CappedArray<char,8ul>>((NoInfer<kj::CappedArray<char,_8UL>_> *)params_local_1);
  rest = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)local_20);
  fill<kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>>(target,first,rest);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}